

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void prvTidyParseBody(TidyDocImpl *doc,Node *body,GetTokenMode mode)

{
  Node **ppNVar1;
  TidyTagId TVar2;
  Lexer *pLVar3;
  Node *pNVar4;
  bool bVar5;
  GetTokenMode GVar6;
  Bool BVar7;
  int iVar8;
  Node *node;
  Dict *pDVar9;
  uint uVar10;
  Dict *pDVar11;
  Node **ppNVar12;
  uint vers;
  GetTokenMode mode_00;
  bool bVar13;
  
  pLVar3 = doc->lexer;
  prvTidyBumpObject(doc,body->parent);
  ppNVar1 = &body->content;
  mode_00 = IgnoreWhitespace;
  bVar5 = true;
LAB_00140556:
  node = prvTidyGetToken(doc,mode_00);
  if (node == (Node *)0x0) {
    return;
  }
  pDVar9 = node->tag;
  pDVar11 = body->tag;
  if ((pDVar9 != pDVar11) || (node->type != StartTag)) {
    if ((pDVar9 != (Dict *)0x0) && (pDVar9->id == TidyTag_HTML)) {
      BVar7 = prvTidynodeIsElement(node);
      if ((BVar7 == no) && (pLVar3->seenEndHtml == no)) {
        pLVar3->seenEndHtml = yes;
        goto LAB_001405b6;
      }
      goto LAB_001405a1;
    }
    if ((pLVar3->seenEndBody != no) && (node->type - StartTag < 3)) {
      prvTidyReport(doc,body,node,0x233);
      pDVar9 = node->tag;
      pDVar11 = body->tag;
    }
    if ((pDVar9 == pDVar11) && (node->type == EndTag)) {
      body->closed = yes;
      TrimSpaces(doc,body);
      prvTidyFreeNode(doc,node);
      pLVar3->seenEndBody = yes;
      mode_00 = IgnoreWhitespace;
      if ((body->parent != (Node *)0x0) &&
         ((pDVar9 = body->parent->tag, pDVar9 != (Dict *)0x0 && (pDVar9->id == TidyTag_NOFRAMES))))
      {
        return;
      }
      goto LAB_00140556;
    }
    if (pDVar9 != (Dict *)0x0) {
      if (pDVar9->id - TidyTag_FRAME < 2) {
LAB_0014065c:
        if (((body->parent != (Node *)0x0) && (pDVar9 = body->parent->tag, pDVar9 != (Dict *)0x0))
           && (pDVar9->id == TidyTag_NOFRAMES)) {
          TrimSpaces(doc,body);
          goto LAB_00140ab6;
        }
      }
      else if (pDVar9->id == TidyTag_NOFRAMES) {
        if (node->type == EndTag) goto LAB_0014065c;
        if (node->type == StartTag) {
          node->parent = body;
          pNVar4 = body->last;
          node->prev = pNVar4;
          ppNVar12 = &pNVar4->next;
          if (pNVar4 == (Node *)0x0) {
            ppNVar12 = ppNVar1;
          }
          *ppNVar12 = node;
          body->last = node;
          prvTidyParseBlock(doc,node,mode_00);
          goto LAB_00140556;
        }
      }
    }
    BVar7 = prvTidynodeIsText(node);
    if ((BVar7 == no) || (node->start + 1 < node->end)) {
      bVar13 = false;
    }
    else {
      bVar13 = pLVar3->lexbuf[node->start] == ' ';
    }
    BVar7 = InsertMisc(body,node);
    if (BVar7 != no) goto LAB_00140556;
    BVar7 = prvTidynodeIsText(node);
    if (BVar7 != no) {
      if (!(bool)(bVar13 ^ 1) && mode_00 == IgnoreWhitespace) {
        prvTidyFreeNode(doc,node);
        mode_00 = IgnoreWhitespace;
        goto LAB_00140556;
      }
      prvTidyConstrainVersion(doc,0xfffffeda);
      if (bVar5) {
        iVar8 = prvTidyInlineDup(doc,node);
        bVar5 = false;
        if (0 < iVar8) goto LAB_00140556;
      }
      node->parent = body;
      pNVar4 = body->last;
      node->prev = pNVar4;
      ppNVar12 = &pNVar4->next;
      if (pNVar4 == (Node *)0x0) {
        ppNVar12 = ppNVar1;
      }
      *ppNVar12 = node;
      body->last = node;
      bVar5 = false;
      mode_00 = MixedContent;
      goto LAB_00140556;
    }
    if (node->type == DocTypeTag) {
      InsertDocType(doc,body,node);
      goto LAB_00140556;
    }
    if ((node->tag == (Dict *)0x0) || (TVar2 = node->tag->id, TVar2 == TidyTag_PARAM))
    goto LAB_001405a1;
    pLVar3->excludeBlocks = no;
    if (((TVar2 == TidyTag_INPUT) ||
        ((BVar7 = prvTidynodeHasCM(node,8), BVar7 == no &&
         (BVar7 = prvTidynodeHasCM(node,0x10), BVar7 == no)))) &&
       (BVar7 = prvTidyIsHTML5Mode(doc), BVar7 == no)) {
      pDVar9 = node->tag;
      uVar10 = pDVar9->model;
      if ((uVar10 & 4) == 0) {
        prvTidyReport(doc,body,node,0x27e);
        pDVar9 = node->tag;
        uVar10 = pDVar9->model;
      }
      if ((uVar10 & 2) != 0) {
        if (((pDVar9->id == TidyTag_BODY) && (body->implicit != no)) &&
           (body->attributes == (AttVal *)0x0)) {
          body->attributes = node->attributes;
          node->attributes = (AttVal *)0x0;
        }
        goto LAB_001405b6;
      }
      if ((uVar10 & 4) == 0) {
        if ((uVar10 & 0x20) == 0) {
          if ((uVar10 & 0x40) == 0) {
            if ((uVar10 & 0x380) == 0) {
              if (pDVar9->id != TidyTag_INPUT) {
                BVar7 = prvTidynodeHasCM(node,0x600);
                if (BVar7 == no) {
LAB_00140ab6:
                  prvTidyUngetToken(doc);
                  return;
                }
                goto LAB_001405b6;
              }
              prvTidyUngetToken(doc);
              TVar2 = TidyTag_FORM;
            }
            else {
              if (node->type == EndTag) goto LAB_00140905;
              prvTidyUngetToken(doc);
              TVar2 = TidyTag_TABLE;
            }
          }
          else {
            prvTidyUngetToken(doc);
            TVar2 = TidyTag_DL;
          }
          node = prvTidyInferredTag(doc,TVar2);
        }
        else {
          prvTidyUngetToken(doc);
          node = prvTidyInferredTag(doc,TidyTag_UL);
          AddClassNoIndent(doc,node);
        }
LAB_00140905:
        pLVar3->excludeBlocks = yes;
        goto LAB_0014090c;
      }
      MoveToHead(doc,body,node);
      goto LAB_00140556;
    }
LAB_0014090c:
    if (node->type == EndTag) {
      if (node->tag == (Dict *)0x0) {
LAB_00140932:
        BVar7 = prvTidynodeHasCM(node,0x10);
        if (BVar7 != no) {
          prvTidyPopInline(doc,node);
        }
      }
      else {
        TVar2 = node->tag->id;
        if (TVar2 == TidyTag_P) {
          node->type = StartEndTag;
          node->implicit = yes;
        }
        else {
          if (TVar2 != TidyTag_BR) goto LAB_00140932;
          node->type = StartTag;
        }
      }
    }
    BVar7 = prvTidynodeIsElement(node);
    if (BVar7 == no) goto LAB_001405a1;
    if (((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_MAIN)) ||
       (BVar7 = prvTidyFindNodeById(doc,TidyTag_MAIN), BVar7 == no)) {
      BVar7 = prvTidynodeHasCM(node,0x10);
      if (BVar7 == no) {
        bVar5 = true;
        GVar6 = IgnoreWhitespace;
      }
      else {
        if ((node->tag == (Dict *)0x0) || (vers = 0xfffffedb, node->tag->id != TidyTag_IMG)) {
          vers = 0xfffffeda;
        }
        prvTidyConstrainVersion(doc,vers);
        if (bVar5) {
          bVar5 = true;
          GVar6 = MixedContent;
          if (node->implicit == no) {
            iVar8 = prvTidyInlineDup(doc,node);
            bVar5 = false;
            GVar6 = MixedContent;
            if (0 < iVar8) goto LAB_00140556;
          }
        }
        else {
          bVar5 = false;
          GVar6 = MixedContent;
        }
      }
      mode_00 = GVar6;
      if (node->implicit != no) {
        prvTidyReport(doc,body,node,0x247);
      }
      node->parent = body;
      pNVar4 = body->last;
      node->prev = pNVar4;
      ppNVar12 = &pNVar4->next;
      if (pNVar4 == (Node *)0x0) {
        ppNVar12 = ppNVar1;
      }
      *ppNVar12 = node;
      body->last = node;
      ParseTag(doc,node,mode_00);
      goto LAB_00140556;
    }
    *(byte *)&doc->badForm = (byte)doc->badForm | 2;
  }
LAB_001405a1:
  prvTidyReport(doc,body,node,0x235);
LAB_001405b6:
  prvTidyFreeNode(doc,node);
  goto LAB_00140556;
}

Assistant:

void TY_(ParseBody)(TidyDocImpl* doc, Node *body, GetTokenMode mode)
{
    Lexer* lexer = doc->lexer;
    Node *node;
    Bool checkstack, iswhitenode;

    mode = IgnoreWhitespace;
    checkstack = yes;

    TY_(BumpObject)( doc, body->parent );

    DEBUG_LOG(SPRTF("Enter ParseBody...\n"));
    while ((node = TY_(GetToken)(doc, mode)) != NULL)
    {
        /* find and discard multiple <body> elements */
        if (node->tag == body->tag && node->type == StartTag)
        {
            TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)(doc, node);
            continue;
        }

        /* #538536 Extra endtags not detected */
        if ( nodeIsHTML(node) )
        {
            if (TY_(nodeIsElement)(node) || lexer->seenEndHtml) 
                TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
            else
                lexer->seenEndHtml = 1;

            TY_(FreeNode)( doc, node);
            continue;
        }

        if ( lexer->seenEndBody && 
             ( node->type == StartTag ||
               node->type == EndTag   ||
               node->type == StartEndTag ) )
        {
            TY_(Report)(doc, body, node, CONTENT_AFTER_BODY );
        }

        if ( node->tag == body->tag && node->type == EndTag )
        {
            body->closed = yes;
            TrimSpaces(doc, body);
            TY_(FreeNode)( doc, node);
            lexer->seenEndBody = 1;
            mode = IgnoreWhitespace;

            if ( nodeIsNOFRAMES(body->parent) )
                break;

            continue;
        }

        if ( nodeIsNOFRAMES(node) )
        {
            if (node->type == StartTag)
            {
                TY_(InsertNodeAtEnd)(body, node);
                TY_(ParseBlock)(doc, node, mode);
                continue;
            }

            if (node->type == EndTag && nodeIsNOFRAMES(body->parent) )
            {
                TrimSpaces(doc, body);
                TY_(UngetToken)( doc );
                break;
            }
        }

        if ( (nodeIsFRAME(node) || nodeIsFRAMESET(node))
             && nodeIsNOFRAMES(body->parent) )
        {
            TrimSpaces(doc, body);
            TY_(UngetToken)( doc );
            break;
        }
        
        iswhitenode = no;

        if ( TY_(nodeIsText)(node) &&
             node->end <= node->start + 1 &&
             lexer->lexbuf[node->start] == ' ' )
            iswhitenode = yes;

        /* deal with comments etc. */
        if (InsertMisc(body, node))
            continue;

        /* mixed content model permits text */
        if (TY_(nodeIsText)(node))
        {
            if (iswhitenode && mode == IgnoreWhitespace)
            {
                TY_(FreeNode)( doc, node);
                continue;
            }

            /* HTML 2 and HTML4 strict don't allow text here */
            TY_(ConstrainVersion)(doc, ~(VERS_HTML40_STRICT | VERS_HTML20));

            if (checkstack)
            {
                checkstack = no;

                if ( TY_(InlineDup)(doc, node) > 0 )
                    continue;
            }

            TY_(InsertNodeAtEnd)(body, node);
            mode = MixedContent;
            continue;
        }

        if (node->type == DocTypeTag)
        {
            InsertDocType(doc, body, node);
            continue;
        }
        /* discard unknown  and PARAM tags */
        if ( node->tag == NULL || nodeIsPARAM(node) )
        {
            TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /*
          Netscape allows LI and DD directly in BODY
          We infer UL or DL respectively and use this
          Bool to exclude block-level elements so as
          to match Netscape's observed behaviour.
        */
        lexer->excludeBlocks = no;
        
        if (( nodeIsINPUT(node) ||
             (!TY_(nodeHasCM)(node, CM_BLOCK) && !TY_(nodeHasCM)(node, CM_INLINE))
           ) && !TY_(IsHTML5Mode)(doc) )
        {
            /* avoid this error message being issued twice */
            if (!(node->tag->model & CM_HEAD))
                TY_(Report)(doc, body, node, TAG_NOT_ALLOWED_IN);

            if (node->tag->model & CM_HTML)
            {
                /* copy body attributes if current body was inferred */
                if ( nodeIsBODY(node) && body->implicit 
                     && body->attributes == NULL )
                {
                    body->attributes = node->attributes;
                    node->attributes = NULL;
                }

                TY_(FreeNode)( doc, node);
                continue;
            }

            if (node->tag->model & CM_HEAD)
            {
                MoveToHead(doc, body, node);
                continue;
            }

            if (node->tag->model & CM_LIST)
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_UL);
                AddClassNoIndent(doc, node);
                lexer->excludeBlocks = yes;
            }
            else if (node->tag->model & CM_DEFLIST)
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_DL);
                lexer->excludeBlocks = yes;
            }
            else if (node->tag->model & (CM_TABLE | CM_ROWGRP | CM_ROW))
            {
                /* http://tidy.sf.net/issue/2855621 */
                if (node->type != EndTag) {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_TABLE);
                }
                lexer->excludeBlocks = yes;
            }
            else if ( nodeIsINPUT(node) )
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_FORM);
                lexer->excludeBlocks = yes;
            }
            else
            {
                if ( !TY_(nodeHasCM)(node, CM_ROW | CM_FIELD) )
                {
                    TY_(UngetToken)( doc );
                    return;
                }

                /* ignore </td> </th> <option> etc. */
                TY_(FreeNode)( doc, node );
                continue;
            }
        }

        if (node->type == EndTag)
        {
            if ( nodeIsBR(node) )
                node->type = StartTag;
            else if ( nodeIsP(node) )
            {
                node->type = StartEndTag;
                node->implicit = yes;
            }
            else if ( TY_(nodeHasCM)(node, CM_INLINE) )
                TY_(PopInline)( doc, node );
        }

        if (TY_(nodeIsElement)(node))
        {
            if (nodeIsMAIN(node)) {
                /*\ Issue #166 - repeated <main> element
                 *  How to efficiently search for a previous main element?
                \*/
                if ( TY_(FindNodeById)(doc, TidyTag_MAIN) )
                {
                    doc->badForm |= flg_BadMain; /* this is an ERROR in format */
                    TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }
            }
            /* Issue #20 - merging from Ger Hobbelt fork put back CM_MIXED, which had been
               removed to fix this issue - reverting to fix 880221e
             */
            if ( TY_(nodeHasCM)(node, CM_INLINE) )
            {
                /* HTML4 strict doesn't allow inline content here */
                /* but HTML2 does allow img elements as children of body */
                if ( nodeIsIMG(node) )
                    TY_(ConstrainVersion)(doc, ~VERS_HTML40_STRICT);
                else
                    TY_(ConstrainVersion)(doc, ~(VERS_HTML40_STRICT|VERS_HTML20));

                if (checkstack && !node->implicit)
                {
                    checkstack = no;

                    if ( TY_(InlineDup)(doc, node) > 0 )
                        continue;
                }

                mode = MixedContent;
            }
            else
            {
                checkstack = yes;
                mode = IgnoreWhitespace;
            }

            if (node->implicit)
                TY_(Report)(doc, body, node, INSERTING_TAG);

            TY_(InsertNodeAtEnd)(body, node);
            ParseTag(doc, node, mode);
            continue;
        }

        /* discard unexpected tags */
        TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }
    DEBUG_LOG(SPRTF("Exit ParseBody 1...\n"));
}